

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
deqp::gles2::Functional::MatrixCaseUtils::matrixCompMult<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  float fVar1;
  float *pfVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  undefined4 local_2c;
  undefined4 local_28;
  int c;
  int r;
  Matrix<float,_2,_2> *b_local;
  Matrix<float,_2,_2> *a_local;
  Matrix<float,_2,_2> *retVal;
  
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()(a,local_28,local_2c);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()(b,local_28,local_2c);
      in_XMM1_Qa.m_data[1] = 0.0;
      in_XMM1_Qa.m_data[0] = *pfVar2;
      VVar3.m_data[0] = fVar1 * *pfVar2;
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_28,local_2c);
      VVar3.m_data[1] = 0.0;
      *pfVar2 = VVar3.m_data[0];
    }
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}